

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *in_RDI;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  EditType move;
  size_t r_i_2;
  size_t l_i_2;
  double replace;
  double remove;
  double add;
  size_t r_i_1;
  size_t l_i_1;
  size_t r_i;
  size_t l_i;
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *best_path;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *in_stack_fffffffffffffe48;
  __normal_iterator<testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  value_type vVar14;
  size_type local_e8;
  size_type local_e0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  local_78 [3];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  std::allocator<double>::allocator((allocator<double> *)0x162697);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (allocator_type *)in_stack_fffffffffffffe60._M_current);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1626cb);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
           (value_type *)in_stack_fffffffffffffe60._M_current,
           (allocator_type *)in_stack_fffffffffffffe58._M_current);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1626ff);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x162719);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  std::allocator<testing::internal::edit_distance::EditType>::allocator
            ((allocator<testing::internal::edit_distance::EditType> *)0x162758);
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
           (allocator_type *)in_stack_fffffffffffffe60._M_current);
  std::
  allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  ::allocator((allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
               *)0x162786);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
           (value_type *)in_stack_fffffffffffffe60._M_current,
           (allocator_type *)in_stack_fffffffffffffe58._M_current);
  std::
  allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  ::~allocator((allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                *)0x1627b4);
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *)in_stack_fffffffffffffe60._M_current);
  std::allocator<testing::internal::edit_distance::EditType>::~allocator
            ((allocator<testing::internal::edit_distance::EditType> *)0x1627ce);
  for (local_a0 = 0;
      sVar5 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&local_30), local_a0 < sVar5; local_a0 = local_a0 + 1) {
    auVar12._8_4_ = (int)(local_a0 >> 0x20);
    auVar12._0_8_ = local_a0;
    auVar12._12_4_ = 0x45300000;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_30,local_a0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
    *pvVar7 = (auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_a0) - 4503599627370496.0);
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[](local_78,local_a0);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,0);
    *pvVar9 = kRemove;
  }
  local_a8 = 1;
  while( true ) {
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_30,0);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    if (sVar5 <= local_a8) break;
    auVar13._8_4_ = (int)(local_a8 >> 0x20);
    auVar13._0_8_ = local_a8;
    auVar13._12_4_ = 0x45300000;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_30,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_a8);
    *pvVar7 = (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0);
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[](local_78,0);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,local_a8);
    *pvVar9 = kAdd;
    local_a8 = local_a8 + 1;
  }
  for (local_b0 = 0;
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
      local_b0 < sVar5; local_b0 = local_b0 + 1) {
    for (local_b8 = 0;
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18),
        local_b8 < sVar5; local_b8 = local_b8 + 1) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_10,local_b0);
      vVar4 = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_18,local_b8);
      if (vVar4 == *pvVar10) {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_30,local_b0);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8);
        vVar14 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_30,local_b0 + 1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8 + 1);
        *pvVar7 = vVar14;
        pvVar8 = std::
                 vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                 ::operator[](local_78,local_b0 + 1);
        pvVar9 = std::
                 vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ::operator[](pvVar8,local_b8 + 1);
        *pvVar9 = kMatch;
      }
      else {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_30,local_b0 + 1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8);
        dVar11 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_30,local_b0);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8 + 1);
        dVar1 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_30,local_b0);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8);
        dVar2 = *pvVar7;
        if ((dVar1 <= dVar11) || (dVar2 <= dVar11)) {
          if ((dVar11 <= dVar1) || (dVar2 <= dVar1)) {
            in_stack_fffffffffffffe58._M_current = (EditType *)(dVar2 + 1.00001);
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_30,local_b0 + 1);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8 + 1);
            *pvVar7 = (value_type)in_stack_fffffffffffffe58._M_current;
            pvVar8 = std::
                     vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                     ::operator[](local_78,local_b0 + 1);
            pvVar9 = std::
                     vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ::operator[](pvVar8,local_b8 + 1);
            *pvVar9 = kReplace;
          }
          else {
            in_stack_fffffffffffffe60._M_current = (EditType *)(dVar1 + 1.0);
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_30,local_b0 + 1);
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8 + 1);
            *pvVar7 = (value_type)in_stack_fffffffffffffe60._M_current;
            pvVar8 = std::
                     vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                     ::operator[](local_78,local_b0 + 1);
            pvVar9 = std::
                     vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ::operator[](pvVar8,local_b8 + 1);
            *pvVar9 = kRemove;
          }
        }
        else {
          dVar11 = dVar11 + 1.0;
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_30,local_b0 + 1);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,local_b8 + 1);
          *pvVar7 = dVar11;
          pvVar8 = std::
                   vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ::operator[](local_78,local_b0 + 1);
          pvVar9 = std::
                   vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   ::operator[](pvVar8,local_b8 + 1);
          *pvVar9 = kAdd;
        }
      }
    }
  }
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)0x162e63);
  local_e0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  local_e8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  for (; local_e0 != 0 || local_e8 != 0; local_e0 = local_e0 - (vVar3 != kAdd)) {
    pvVar8 = std::
             vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             ::operator[](local_78,local_e0);
    pvVar9 = std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::operator[](pvVar8,local_e8);
    vVar3 = *pvVar9;
    std::
    vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ::push_back((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 *)in_stack_fffffffffffffe60._M_current,in_stack_fffffffffffffe58._M_current);
    local_e8 = local_e8 - (vVar3 != kRemove);
  }
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::begin(in_stack_fffffffffffffe48);
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::end(in_stack_fffffffffffffe48);
  std::
  reverse<__gnu_cxx::__normal_iterator<testing::internal::edit_distance::EditType*,std::vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)in_stack_fffffffffffffe60._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffe60._M_current);
  return in_RDI;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}